

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daxpy.c
# Opt level: O0

int daxpy_(int *n,double *sa,double *sx,int *incx,double *sy,int *incy)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long local_88;
  long local_80;
  double ssa;
  long iincy;
  long iincx;
  long nn;
  long iy;
  long ix;
  long m;
  long i;
  int *incy_local;
  double *sy_local;
  int *incx_local;
  double *sx_local;
  double *sa_local;
  int *n_local;
  
  lVar2 = (long)*n;
  dVar1 = *sa;
  lVar3 = (long)*incx;
  lVar4 = (long)*incy;
  if ((0 < lVar2) && ((dVar1 != 0.0 || (NAN(dVar1))))) {
    if ((lVar3 == 1) && (lVar4 == 1)) {
      for (m = 0; m < lVar2 + -3; m = m + 4) {
        sy[m] = dVar1 * sx[m] + sy[m];
        sy[m + 1] = dVar1 * sx[m + 1] + sy[m + 1];
        sy[m + 2] = dVar1 * sx[m + 2] + sy[m + 2];
        sy[m + 3] = dVar1 * sx[m + 3] + sy[m + 3];
      }
      for (; m < lVar2; m = m + 1) {
        sy[m] = dVar1 * sx[m] + sy[m];
      }
    }
    else {
      if (lVar3 < 0) {
        local_80 = (1 - lVar2) * lVar3;
      }
      else {
        local_80 = 0;
      }
      iy = local_80;
      if (lVar4 < 0) {
        local_88 = (1 - lVar2) * lVar4;
      }
      else {
        local_88 = 0;
      }
      nn = local_88;
      for (m = 0; m < lVar2; m = m + 1) {
        sy[nn] = dVar1 * sx[iy] + sy[nn];
        iy = lVar3 + iy;
        nn = lVar4 + nn;
      }
    }
  }
  return 0;
}

Assistant:

int daxpy_(int *n, double *sa, double *sx, int *incx, double *sy,
           int *incy)
{
  long int i, m, ix, iy, nn, iincx, iincy;
  register double ssa;

  /* constant times a vector plus a vector.   
     uses unrolled loop for increments equal to one.   
     jack dongarra, linpack, 3/11/78.   
     modified 12/3/93, array(1) declarations changed to array(*) */

  /* Dereference inputs */
  nn = *n;
  ssa = *sa;
  iincx = *incx;
  iincy = *incy;

  if( nn > 0 && ssa != 0.0 )
  {
    if (iincx == 1 && iincy == 1) /* code for both increments equal to 1 */
    {
      m = nn-3;
      for (i = 0; i < m; i += 4)
      {
        sy[i] += ssa * sx[i];
        sy[i+1] += ssa * sx[i+1];
        sy[i+2] += ssa * sx[i+2];
        sy[i+3] += ssa * sx[i+3];
      }
      for ( ; i < nn; ++i) /* clean-up loop */
        sy[i] += ssa * sx[i];
    }
    else /* code for unequal increments or equal increments not equal to 1 */
    {
      ix = iincx >= 0 ? 0 : (1 - nn) * iincx;
      iy = iincy >= 0 ? 0 : (1 - nn) * iincy;
      for (i = 0; i < nn; i++)
      {
        sy[iy] += ssa * sx[ix];
        ix += iincx;
        iy += iincy;
      }
    }
  }

  return 0;
}